

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtMan.c
# Opt level: O1

Cgt_Man_t * Cgt_ManCreate(Aig_Man_t *pAig,Aig_Man_t *pCare,Cgt_Par_t *pPars)

{
  uint uVar1;
  Cgt_Man_t *__s;
  Vec_Vec_t *pVVar2;
  void **ppvVar3;
  undefined8 *puVar4;
  Vec_Ptr_t *pVVar5;
  uint uVar6;
  ulong uVar7;
  
  if (0 < pAig->nRegs) {
    Aig_ManFanoutStart(pAig);
    Aig_ManSetCioIds(pAig);
    __s = (Cgt_Man_t *)malloc(0xd8);
    ppvVar3 = (void **)0x0;
    memset(__s,0,0xd8);
    __s->pPars = pPars;
    __s->pAig = pAig;
    uVar1 = pAig->nRegs;
    pVVar2 = (Vec_Vec_t *)malloc(0x10);
    uVar6 = 8;
    if (6 < uVar1 - 1) {
      uVar6 = uVar1;
    }
    pVVar2->nSize = 0;
    pVVar2->nCap = uVar6;
    if (uVar6 != 0) {
      ppvVar3 = (void **)malloc((long)(int)uVar6 << 3);
    }
    pVVar2->pArray = ppvVar3;
    if (0 < (int)uVar1) {
      uVar7 = 0;
      do {
        puVar4 = (undefined8 *)malloc(0x10);
        *puVar4 = 0;
        puVar4[1] = 0;
        ppvVar3[uVar7] = puVar4;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
    pVVar2->nSize = uVar1;
    __s->vGatesAll = pVVar2;
    pVVar5 = (Vec_Ptr_t *)malloc(0x10);
    pVVar5->nCap = 1000;
    pVVar5->nSize = 0;
    ppvVar3 = (void **)malloc(8000);
    pVVar5->pArray = ppvVar3;
    __s->vFanout = pVVar5;
    pVVar5 = (Vec_Ptr_t *)malloc(0x10);
    pVVar5->nCap = 1000;
    pVVar5->nSize = 0;
    ppvVar3 = (void **)malloc(8000);
    pVVar5->pArray = ppvVar3;
    __s->vVisited = pVVar5;
    __s->nPattWords = 0x10;
    if (pCare != (Aig_Man_t *)0x0) {
      if (pCare->nObjs[2] == pAig->nObjs[2]) {
        __s->pCare = pCare;
        pVVar5 = Aig_ManSupportsInverse(pCare);
        __s->vSuppsInv = (Vec_Vec_t *)pVVar5;
      }
      else {
        printf("The PI count of care (%d) and AIG (%d) differ. Careset is not used.\n");
      }
    }
    return __s;
  }
  __assert_fail("Saig_ManRegNum(pAig) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cgt/cgtMan.c"
                ,0x31,"Cgt_Man_t *Cgt_ManCreate(Aig_Man_t *, Aig_Man_t *, Cgt_Par_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates the manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Cgt_Man_t * Cgt_ManCreate( Aig_Man_t * pAig, Aig_Man_t * pCare, Cgt_Par_t * pPars )
{
    Cgt_Man_t * p;
    // prepare the sequential AIG
    assert( Saig_ManRegNum(pAig) > 0 );
    Aig_ManFanoutStart( pAig );
    Aig_ManSetCioIds( pAig );
    // create interpolation manager
    p = ABC_ALLOC( Cgt_Man_t, 1 ); 
    memset( p, 0, sizeof(Cgt_Man_t) );
    p->pPars      = pPars;
    p->pAig       = pAig;
    p->vGatesAll  = Vec_VecStart( Saig_ManRegNum(pAig) );
    p->vFanout    = Vec_PtrAlloc( 1000 );
    p->vVisited   = Vec_PtrAlloc( 1000 );
    p->nPattWords = 16;
    if ( pCare == NULL )
        return p;
    // check out the constraints
    if ( Aig_ManCiNum(pCare) != Aig_ManCiNum(pAig) )
    {
        printf( "The PI count of care (%d) and AIG (%d) differ. Careset is not used.\n", 
            Aig_ManCiNum(pCare), Aig_ManCiNum(pAig) );
        return p;
    }
    p->pCare = pCare;
    p->vSuppsInv = (Vec_Vec_t *)Aig_ManSupportsInverse( p->pCare );
    return p;
}